

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.h
# Opt level: O1

void __thiscall
Js::AsmJsFunctionTable::AsmJsFunctionTable
          (AsmJsFunctionTable *this,PropertyName name,ArenaAllocator *allocator)

{
  AsmJsFunctionDeclaration::AsmJsFunctionDeclaration
            (&this->super_AsmJsFunctionDeclaration,name,FuncPtrTable,allocator);
  (this->super_AsmJsFunctionDeclaration).super_AsmJsSymbol._vptr_AsmJsSymbol =
       (_func_int **)&PTR_GetType_014fed68;
  (this->mTable).super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>.buffer =
       (Type)0x0;
  (this->mTable).super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>.count = 0
  ;
  (this->mTable).super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       allocator;
  (this->mTable).super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014ea098;
  (this->mTable).length = 0;
  (this->mTable).increment = 4;
  this->mSize = 0;
  this->field_0x6c = this->field_0x6c & 0xfc;
  return;
}

Assistant:

AsmJsFunctionTable( PropertyName name, ArenaAllocator* allocator ) :
            AsmJsFunctionDeclaration( name, symbolType, allocator )
            , mTable(allocator)
            , mSize( 0 )
            , mIsDefined( false )
            , mAreArgumentsKnown( false )
        {

        }